

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_operator_matrix_subraction_assignement_Test::TestBody
          (test_matrix_sparse_operator_matrix_subraction_assignement_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<double> value_01;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> index_01;
  initializer_list<unsigned_long> non_zero_01;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Scalar *pSVar5;
  char *regex;
  AssertHelper local_598;
  Message local_590;
  int local_584;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_530;
  DeathTest *gtest_dt;
  undefined8 uStack_520;
  undefined8 local_518;
  DeathTest **local_508;
  undefined8 uStack_500;
  unsigned_long local_4f8 [4];
  iterator local_4d8;
  undefined8 local_4d0;
  unsigned_long local_4c8 [4];
  iterator local_4a8;
  undefined8 local_4a0;
  undefined1 local_498 [8];
  Matrix_Sparse matrix_wrong_size;
  Message local_440;
  size_t local_438 [2];
  undefined1 local_428 [16];
  undefined1 local_418 [8];
  AssertionResult gtest_ar_10;
  Message local_400;
  pointer local_3f8;
  pointer local_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_9;
  Message local_3c0;
  pointer local_3b8;
  pointer local_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [8];
  AssertionResult gtest_ar_8;
  Message local_380;
  pointer local_378;
  pointer local_370;
  undefined1 local_368 [16];
  undefined1 local_358 [8];
  AssertionResult gtest_ar_7;
  Message local_340;
  pointer local_338;
  pointer local_330;
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  AssertionResult gtest_ar_6;
  Message local_300;
  int local_2f4;
  pointer local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_5;
  Message local_2d0;
  int local_2c4;
  size_t local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_4;
  Message local_2a0;
  int local_294;
  size_t local_290;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_3;
  Message local_270;
  int local_264;
  size_t local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_2;
  Message local_240;
  int local_234;
  size_t local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_1;
  Message local_210;
  int local_204;
  size_t local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  double local_1d8 [4];
  iterator local_1b8;
  undefined8 uStack_1b0;
  unsigned_long local_1a8 [4];
  iterator local_188;
  undefined8 local_180;
  unsigned_long local_178 [4];
  iterator local_158;
  undefined8 local_150;
  undefined1 local_148 [8];
  Matrix_Sparse matrix;
  unsigned_long local_c8 [4];
  iterator local_a8;
  undefined8 local_a0;
  unsigned_long local_98 [5];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  Matrix_Sparse identity;
  test_matrix_sparse_operator_matrix_subraction_assignement_Test *this_local;
  
  local_98[2] = 2;
  local_98[3] = 3;
  local_98[0] = 0;
  local_98[1] = 1;
  local_70 = local_98;
  local_68 = 4;
  local_c8[0] = 0;
  local_c8[1] = 1;
  local_c8[2] = 2;
  local_a8 = local_c8;
  local_a0 = 3;
  matrix.column_size = 0x3ff0000000000000;
  non_zero_01._M_len = 4;
  non_zero_01._M_array = local_70;
  index_01._M_len = 3;
  index_01._M_array = local_a8;
  value._M_len = 3;
  value._M_array = (iterator)&matrix.column_size;
  identity.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60,non_zero_01,index_01,value,3);
  local_178[2] = 2;
  local_178[3] = 3;
  local_178[0] = 0;
  local_178[1] = 1;
  local_158 = local_178;
  local_150 = 4;
  local_1a8[0] = 2;
  local_1a8[1] = 1;
  local_1a8[2] = 0;
  local_188 = local_1a8;
  local_180 = 3;
  local_1d8[2] = 5.0;
  local_1d8[0] = 3.0;
  local_1d8[1] = -4.0;
  local_1b8 = local_1d8;
  uStack_1b0 = 3;
  non_zero_00._M_len = 4;
  non_zero_00._M_array = local_158;
  index_00._M_len = 3;
  index_00._M_array = local_188;
  value_00._M_len = 3;
  value_00._M_array = local_1b8;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_148,non_zero_00,index_00,value_00,3);
  Disa::Matrix_Sparse::operator-=((Matrix_Sparse *)local_148,(matrix *)local_60);
  local_200 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_204 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1f8,"identity.size_row()","3",&local_200,&local_204);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x23e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_230 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_234 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_228,"identity.size_column()","3",&local_230,&local_234);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x23f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_260 = Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_264 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_258,"identity.size_non_zero()","3",&local_260,&local_264);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x240,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_290 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_148);
  local_294 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_288,"matrix.size_row()","3",&local_290,&local_294);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x242,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2c0 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_148);
  local_2c4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2b8,"matrix.size_column()","3",&local_2c0,&local_2c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x243,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_2f0 = (pointer)Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_148);
  local_2f4 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2e8,"matrix.size_non_zero()","5",(unsigned_long *)&local_2f0,
             &local_2f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x244,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_330 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_328,(size_t *)local_148);
  local_338 = (pointer)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_328,(size_t *)&local_338);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_318,"matrix[0][0]","-1.0",*pSVar5,-1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x245,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  local_370 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_368,(size_t *)local_148);
  local_378 = (pointer)0x2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_368,(size_t *)&local_378);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_358,"matrix[0][2]","3.0",*pSVar5,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x246,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  local_3b0 = (pointer)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_3a8,(size_t *)local_148);
  local_3b8 = (pointer)0x1;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_3a8,(size_t *)&local_3b8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_398,"matrix[1][1]","-5.0",*pSVar5,-5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x247,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  local_3f0 = (pointer)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_3e8,(size_t *)local_148);
  local_3f8 = (pointer)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_3e8,(size_t *)&local_3f8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3d8,"matrix[2][0]","5.0",*pSVar5,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x248,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  local_438[1] = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_428,(size_t *)local_148);
  local_438[0] = 2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_428,local_438);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_418,"matrix[2][2]","-1.0",*pSVar5,-1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&matrix_wrong_size.column_size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x249,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&matrix_wrong_size.column_size,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&matrix_wrong_size.column_size);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  local_4c8[2] = 2;
  local_4c8[3] = 3;
  local_4c8[0] = 0;
  local_4c8[1] = 1;
  local_4a8 = local_4c8;
  local_4a0 = 4;
  local_4f8[0] = 2;
  local_4f8[1] = 1;
  local_4f8[2] = 0;
  local_4d8 = local_4f8;
  local_4d0 = 3;
  local_518 = 0x4014000000000000;
  gtest_dt = (DeathTest *)0x4008000000000000;
  uStack_520 = 0xc010000000000000;
  local_508 = &gtest_dt;
  uStack_500 = 3;
  non_zero._M_len = 4;
  non_zero._M_array = local_4a8;
  index._M_len = 3;
  index._M_array = local_4d8;
  value_01._M_len = 3;
  value_01._M_array = (iterator)local_508;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_498,non_zero,index,value_01,4);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("matrix -= matrix_wrong_size",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x24c,&local_530);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_530 == (pointer)0x0) goto LAB_00134c53;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_530);
      iVar2 = (*local_530->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_530->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_530->_vptr_DeathTest[4])(local_530,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00134b64;
        local_584 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_530);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Disa::Matrix_Sparse::operator-=((Matrix_Sparse *)local_148,(matrix *)local_498);
          }
          (*local_530->_vptr_DeathTest[5])(local_530,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_00134b64:
        local_584 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_584 == 0) goto LAB_00134c53;
    }
  }
  testing::Message::Message(&local_590);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_598,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
             ,0x24c,pcVar4);
  testing::internal::AssertHelper::operator=(&local_598,&local_590);
  testing::internal::AssertHelper::~AssertHelper(&local_598);
  testing::Message::~Message(&local_590);
LAB_00134c53:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_498);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_148);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_matrix_subraction_assignement) {
  Matrix_Sparse identity({0, 1, 2, 3}, {0, 1, 2}, {1.0, 1.0, 1.0}, 3);
  Matrix_Sparse matrix({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 3);
  matrix -= identity;

  EXPECT_EQ(identity.size_row(), 3);
  EXPECT_EQ(identity.size_column(), 3);
  EXPECT_EQ(identity.size_non_zero(), 3);

  EXPECT_EQ(matrix.size_row(), 3);
  EXPECT_EQ(matrix.size_column(), 3);
  EXPECT_EQ(matrix.size_non_zero(), 5);
  EXPECT_DOUBLE_EQ(matrix[0][0], -1.0);
  EXPECT_DOUBLE_EQ(matrix[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix[1][1], -5.0);
  EXPECT_DOUBLE_EQ(matrix[2][0], 5.0);
  EXPECT_DOUBLE_EQ(matrix[2][2], -1.0);

  Matrix_Sparse matrix_wrong_size({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 4);
  EXPECT_DEATH(matrix -= matrix_wrong_size, "./*");
}